

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,uint value)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (cctx->streamStage != zcss_init) {
    if (((5 < param - ZSTD_p_hashLog) && (param != ZSTD_p_compressLiterals)) &&
       (param != ZSTD_p_compressionLevel)) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  if ((int)param < 0xa0) {
    if (6 < param - ZSTD_p_windowLog) {
      if (param == ZSTD_p_format) {
        if (1 < value) {
          return 0xffffffffffffffd8;
        }
        (cctx->requestedParams).format = value;
        return (ulong)value;
      }
      if (param != ZSTD_p_compressionLevel) {
        return 0xffffffffffffffd8;
      }
      if (cctx->cdict != (ZSTD_CDict *)0x0) {
        return 0xffffffffffffffc4;
      }
      if (value != 0) {
        uVar2 = 0x16;
        if ((int)value < 0x16) {
          uVar2 = (ulong)value;
        }
        (cctx->requestedParams).disableLiteralCompression = (int)(uVar2 >> 0x1f);
        (cctx->requestedParams).compressionLevel = (int)uVar2;
      }
      uVar1 = (cctx->requestedParams).compressionLevel;
      sVar3 = 0;
      if (0 < (int)uVar1) {
        sVar3 = (size_t)uVar1;
      }
      return sVar3;
    }
  }
  else {
    if (399 < (int)param) {
      if ((int)param < 1000) {
        if (1 < param - ZSTD_p_jobSize) {
          if (param != ZSTD_p_nbWorkers) {
            return 0xffffffffffffffd8;
          }
          sVar3 = 0xffffffffffffffd8;
          if (value == 0) {
            sVar3 = 0;
          }
          return sVar3;
        }
      }
      else if (param != ZSTD_p_compressLiterals) {
        if (param != ZSTD_p_forceMaxWindow) {
          return 0xffffffffffffffd8;
        }
        (cctx->requestedParams).forceWindow = (uint)(value != 0);
        return (ulong)(value != 0);
      }
      goto LAB_0015518b;
    }
    if (4 < param - ZSTD_p_enableLongDistanceMatching) {
      if (2 < param - ZSTD_p_contentSizeFlag) {
        return 0xffffffffffffffd8;
      }
      goto LAB_0015518b;
    }
  }
  if (cctx->cdict != (ZSTD_CDict *)0x0) {
    return 0xffffffffffffffc4;
  }
LAB_0015518b:
  sVar3 = ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
  return sVar3;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, unsigned value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%u, %u)", (U32)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            return ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_p_format :
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressionLevel:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_windowLog:
    case ZSTD_p_hashLog:
    case ZSTD_p_chainLog:
    case ZSTD_p_searchLog:
    case ZSTD_p_minMatch:
    case ZSTD_p_targetLength:
    case ZSTD_p_compressionStrategy:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressLiterals:
    case ZSTD_p_contentSizeFlag:
    case ZSTD_p_checksumFlag:
    case ZSTD_p_dictIDFlag:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_forceMaxWindow :  /* Force back-references to remain < windowSize,
                                   * even when referencing into Dictionary content.
                                   * default : 0 when using a CDict, 1 when using a Prefix */
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_nbWorkers:
        if ((value>0) && cctx->staticSize) {
            return ERROR(parameter_unsupported);  /* MT not compatible with static alloc */
        }
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_jobSize:
    case ZSTD_p_overlapSizeLog:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_enableLongDistanceMatching:
    case ZSTD_p_ldmHashLog:
    case ZSTD_p_ldmMinMatch:
    case ZSTD_p_ldmBucketSizeLog:
    case ZSTD_p_ldmHashEveryLog:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    default: return ERROR(parameter_unsupported);
    }
}